

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O1

REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid)

{
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar3;
  REF_NODE ref_node_00;
  REF_ADJ pRVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  REF_INT *pRVar9;
  long lVar10;
  REF_INT *pRVar11;
  long lVar12;
  REF_INT *pRVar13;
  void *pvVar14;
  void *pvVar15;
  REF_DBL *pRVar16;
  REF_ADJ_ITEM pRVar17;
  REF_GEOM pRVar18;
  int *piVar19;
  REF_INT RVar20;
  undefined8 uVar21;
  long lVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  long lVar26;
  int iVar27;
  bool bVar28;
  REF_INT degree;
  uint local_e8;
  uint local_d8;
  uint local_cc;
  REF_INT *local_c8;
  REF_INT *local_c0;
  REF_INT *local_b8;
  void *local_b0;
  REF_GEOM local_a8;
  REF_DBL *local_a0;
  void *local_98;
  REF_ADJ_ITEM local_90;
  void *local_88;
  void *local_80;
  int local_74;
  int *local_70;
  REF_GLOB *local_68;
  long local_60;
  long local_58;
  REF_MPI local_50;
  int local_48 [6];
  
  pRVar2 = ref_grid->mpi;
  if (pRVar2->n < 2) {
    return 0;
  }
  ref_node = ref_grid->node;
  uVar6 = ref_node_synchronize_globals(ref_node);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x69f
           ,"ref_migrate_shufflin",(ulong)uVar6,"sync global nodes");
    return uVar6;
  }
  ref_mpi = ref_node->ref_mpi;
  iVar7 = ref_mpi->n;
  local_50 = pRVar2;
  if ((long)iVar7 < 0) {
    local_e8 = 1;
    pcVar24 = "malloc a_size of REF_INT negative";
LAB_00229a03:
    bVar28 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x570
           ,"ref_migrate_shufflin_node",pcVar24);
    pRVar9 = (REF_INT *)0x0;
  }
  else {
    pRVar9 = (REF_INT *)malloc((long)iVar7 * 4);
    if (pRVar9 == (REF_INT *)0x0) {
      local_e8 = 2;
      pcVar24 = "malloc a_size of REF_INT NULL";
      goto LAB_00229a03;
    }
    bVar28 = true;
    if (iVar7 != 0) {
      lVar10 = 0;
      do {
        pRVar9[lVar10] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < ref_mpi->n);
    }
  }
  if (bVar28) {
    iVar7 = ref_mpi->n;
    if ((long)iVar7 < 0) {
      local_e8 = 1;
      pcVar24 = "malloc b_size of REF_INT negative";
LAB_00229a9c:
      bVar28 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x571,"ref_migrate_shufflin_node",pcVar24);
      pRVar11 = (REF_INT *)0x0;
    }
    else {
      pRVar11 = (REF_INT *)malloc((long)iVar7 * 4);
      if (pRVar11 == (REF_INT *)0x0) {
        local_e8 = 2;
        pcVar24 = "malloc b_size of REF_INT NULL";
        goto LAB_00229a9c;
      }
      bVar28 = true;
      if (iVar7 != 0) {
        lVar10 = 0;
        do {
          pRVar11[lVar10] = 0;
          lVar10 = lVar10 + 1;
        } while (lVar10 < ref_mpi->n);
      }
    }
    if (bVar28) {
      iVar7 = ref_node->max;
      if (0 < (long)iVar7) {
        pRVar3 = ref_node->global;
        lVar10 = 0;
        do {
          if (-1 < pRVar3[lVar10]) {
            uVar6 = ref_node->part[lVar10];
            if (ref_mpi->id != uVar6) {
              if (((int)uVar6 < 0) || (ref_mpi->n <= (int)uVar6)) {
                printf("id %d node %d global %ld part %d ");
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x57a,"ref_migrate_shufflin_node","part out of range");
                local_e8 = 1;
                goto LAB_0022a08b;
              }
              pRVar9[uVar6] = pRVar9[uVar6] + 1;
            }
          }
          lVar10 = lVar10 + 1;
        } while (iVar7 != lVar10);
      }
      local_e8 = ref_mpi_alltoall(ref_mpi,pRVar9,pRVar11,1);
      if (local_e8 == 0) {
        iVar7 = ref_mpi->n;
        lVar10 = (long)iVar7;
        if (lVar10 < 1) {
          uVar6 = 0;
        }
        else {
          lVar12 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + pRVar9[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar10 != lVar12);
        }
        if ((int)uVar6 < 0) {
          pcVar24 = "malloc a_global of REF_GLOB negative";
          uVar21 = 0x585;
LAB_00229ca2:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,uVar21,"ref_migrate_shufflin_node",pcVar24);
          local_e8 = 1;
        }
        else {
          pRVar13 = (REF_INT *)malloc((ulong)uVar6 << 3);
          if (pRVar13 == (REF_INT *)0x0) {
            pcVar24 = "malloc a_global of REF_GLOB NULL";
            uVar21 = 0x585;
          }
          else {
            local_c0 = pRVar13;
            pvVar14 = malloc((ulong)(uVar6 * 0xf) << 3);
            if (pvVar14 == (void *)0x0) {
              pcVar24 = "malloc a_real of REF_DBL NULL";
              uVar21 = 0x586;
            }
            else {
              uVar8 = ref_node->naux;
              local_a8 = (REF_GEOM)(long)(int)uVar8;
              local_c8 = (REF_INT *)(ulong)uVar8;
              if ((long)local_a8 < 1) {
                pvVar15 = (void *)0x0;
              }
              else {
                pvVar15 = malloc((ulong)(uVar6 * uVar8) << 3);
                if (pvVar15 == (void *)0x0) {
                  pcVar24 = "malloc a_aux of REF_DBL NULL";
                  uVar21 = 0x589;
                  goto LAB_0022a004;
                }
              }
              pRVar13 = (REF_INT *)0x0;
              if (0 < iVar7) {
                lVar12 = 0;
                pRVar13 = (REF_INT *)0x0;
                do {
                  pRVar13 = (REF_INT *)(ulong)(uint)((int)pRVar13 + pRVar11[lVar12]);
                  lVar12 = lVar12 + 1;
                } while (lVar10 != lVar12);
              }
              if ((int)pRVar13 < 0) {
                pcVar24 = "malloc b_global of REF_GLOB negative";
                uVar21 = 0x58d;
                goto LAB_00229ca2;
              }
              local_b0 = pvVar15;
              pRVar16 = (REF_DBL *)malloc((long)pRVar13 << 3);
              if (pRVar16 == (REF_DBL *)0x0) {
                pcVar24 = "malloc b_global of REF_GLOB NULL";
                uVar21 = 0x58d;
              }
              else {
                local_b8 = pRVar13;
                local_a0 = pRVar16;
                pRVar17 = (REF_ADJ_ITEM)malloc((ulong)(uint)((int)pRVar13 * 0xf) << 3);
                if (pRVar17 == (REF_ADJ_ITEM)0x0) {
                  pcVar24 = "malloc b_real of REF_DBL NULL";
                  uVar21 = 0x58e;
                }
                else {
                  local_90 = pRVar17;
                  if ((int)local_a8 < 1) {
                    pvVar15 = (void *)0x0;
                  }
                  else {
                    pvVar15 = malloc((ulong)(uint)((int)local_b8 * (int)local_a8) << 3);
                    if (pvVar15 == (void *)0x0) {
                      pcVar24 = "malloc b_aux of REF_DBL NULL";
                      uVar21 = 0x591;
                      goto LAB_0022a004;
                    }
                  }
                  if (iVar7 < 0) {
                    pcVar24 = "malloc a_next of REF_INT negative";
                    uVar21 = 0x593;
                    goto LAB_00229ca2;
                  }
                  local_98 = pvVar15;
                  pRVar18 = (REF_GEOM)malloc(lVar10 * 4);
                  if (pRVar18 != (REF_GEOM)0x0) {
                    pRVar18->n = 0;
                    if (1 < iVar7) {
                      iVar7 = pRVar18->n;
                      lVar12 = 0;
                      do {
                        iVar7 = iVar7 + pRVar9[lVar12];
                        (&pRVar18->max)[lVar12] = iVar7;
                        lVar12 = lVar12 + 1;
                      } while (lVar10 + -1 != lVar12);
                    }
                    iVar7 = ref_node->max;
                    if (0 < (long)iVar7) {
                      pRVar3 = ref_node->global;
                      lVar10 = 0;
                      lVar12 = 0;
                      lVar26 = 0;
                      do {
                        if ((-1 < pRVar3[lVar26]) &&
                           (iVar27 = ref_node->part[lVar26], ref_mpi->id != iVar27)) {
                          iVar1 = (&pRVar18->n)[iVar27];
                          *(REF_GLOB *)(local_c0 + (long)iVar1 * 2) = pRVar3[lVar26];
                          pRVar16 = ref_node->real;
                          lVar22 = 0;
                          do {
                            *(undefined8 *)((long)pvVar14 + lVar22 * 8 + (long)iVar1 * 0x78) =
                                 *(undefined8 *)((long)pRVar16 + lVar22 * 8 + lVar12);
                            lVar22 = lVar22 + 1;
                          } while (lVar22 != 0xf);
                          if (0 < (int)local_c8) {
                            pRVar16 = ref_node->aux;
                            pRVar13 = (REF_INT *)0x0;
                            do {
                              *(undefined8 *)
                               ((long)local_b0 +
                               (long)pRVar13 * 8 + (long)(iVar1 * (int)local_c8) * 8) =
                                   *(undefined8 *)((long)pRVar16 + (long)pRVar13 * 8 + lVar10);
                              pRVar13 = (REF_INT *)((long)pRVar13 + 1);
                            } while (local_c8 != pRVar13);
                          }
                          (&pRVar18->n)[iVar27] = iVar1 + 1;
                        }
                        lVar26 = lVar26 + 1;
                        lVar12 = lVar12 + 0x78;
                        lVar10 = lVar10 + (long)local_a8 * 8;
                      } while (lVar26 != iVar7);
                    }
                    local_a8 = pRVar18;
                    local_e8 = ref_mpi_alltoallv(ref_mpi,local_c0,pRVar9,local_a0,pRVar11,1,2);
                    if (local_e8 == 0) {
                      local_e8 = ref_mpi_alltoallv(ref_mpi,pvVar14,pRVar9,local_90,pRVar11,0xf,3);
                      if (local_e8 == 0) {
                        if ((ref_node->naux < 1) ||
                           (local_e8 = ref_mpi_alltoallv(ref_mpi,local_b0,pRVar9,local_98,pRVar11,
                                                         ref_node->naux,3), local_e8 == 0)) {
                          local_e8 = ref_node_add_many(ref_node,(REF_INT)local_b8,
                                                       (REF_GLOB *)local_a0);
                          if (local_e8 == 0) {
                            if ((int)local_b8 != 0) {
                              pRVar13 = (REF_INT *)0x1;
                              if (1 < (int)local_b8) {
                                pRVar13 = (REF_INT *)((ulong)local_b8 & 0xffffffff);
                              }
                              lVar10 = 0;
                              local_c8 = (REF_INT *)0x0;
                              pRVar17 = local_90;
                              local_b8 = pRVar13;
                              do {
                                local_e8 = ref_node_local(ref_node,(REF_GLOB)
                                                                   local_a0[(long)local_c8],local_48
                                                         );
                                if (local_e8 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                         ,0x5b6,"ref_migrate_shufflin_node",(ulong)local_e8,"local")
                                  ;
                                  goto LAB_0022a08b;
                                }
                                lVar12 = (long)local_48[0];
                                pRVar16 = ref_node->real;
                                lVar26 = 0;
                                do {
                                  *(REF_ADJ_ITEM_STRUCT *)(pRVar16 + lVar12 * 0xf + lVar26) =
                                       pRVar17[lVar26];
                                  lVar26 = lVar26 + 1;
                                } while (lVar26 != 0xf);
                                lVar26 = (long)ref_node->naux;
                                if (0 < lVar26) {
                                  pRVar16 = ref_node->aux;
                                  lVar22 = 0;
                                  do {
                                    pRVar16[lVar26 * lVar12 + lVar22] =
                                         *(REF_DBL *)((long)local_98 + lVar22 * 8 + lVar10 * lVar26)
                                    ;
                                    lVar22 = lVar22 + 1;
                                  } while (lVar26 != lVar22);
                                }
                                ref_node->part[lVar12] = ref_mpi->id;
                                local_c8 = (REF_INT *)((long)local_c8 + 1);
                                pRVar17 = pRVar17 + 0xf;
                                lVar10 = lVar10 + 8;
                              } while (local_c8 != local_b8);
                            }
                            free(local_a8);
                            if (local_98 != (void *)0x0) {
                              free(local_98);
                            }
                            free(local_90);
                            free(local_a0);
                            if (local_b0 != (void *)0x0) {
                              free(local_b0);
                            }
                            free(pvVar14);
                            free(local_c0);
                            if (pRVar11 != (REF_INT *)0x0) {
                              free(pRVar11);
                            }
                            if (pRVar9 != (REF_INT *)0x0) {
                              free(pRVar9);
                            }
                            local_e8 = 0;
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x5b3,"ref_migrate_shufflin_node",(ulong)local_e8,"add many");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x5b1,"ref_migrate_shufflin_node",(ulong)local_e8,"alltoallv aux")
                          ;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x5ac,"ref_migrate_shufflin_node",(ulong)local_e8,"alltoallv real");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x5a8,"ref_migrate_shufflin_node",(ulong)local_e8,"alltoallv global");
                    }
                    goto LAB_0022a08b;
                  }
                  pcVar24 = "malloc a_next of REF_INT NULL";
                  uVar21 = 0x593;
                }
              }
            }
          }
LAB_0022a004:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,uVar21,"ref_migrate_shufflin_node",pcVar24);
          local_e8 = 2;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x581,"ref_migrate_shufflin_node",(ulong)local_e8,"alltoall sizes");
      }
    }
  }
LAB_0022a08b:
  if (local_e8 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6a1
           ,"ref_migrate_shufflin",(ulong)local_e8,"send out nodes");
    return local_e8;
  }
  pRVar2 = ref_grid->mpi;
  local_d8 = 0;
  if ((long)pRVar2->n < 2) goto LAB_0022a830;
  ref_node_00 = ref_grid->node;
  local_a8 = ref_grid->geom;
  pRVar4 = local_a8->ref_adj;
  pRVar9 = (REF_INT *)malloc((long)pRVar2->n << 2);
  if (pRVar9 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x64b
           ,"ref_migrate_shufflin_geom","malloc a_size of REF_INT NULL");
    pRVar11 = (REF_INT *)0x0;
  }
  else {
    lVar10 = 0;
    do {
      pRVar9[lVar10] = 0;
      lVar10 = lVar10 + 1;
      pRVar11 = pRVar9;
    } while (lVar10 < pRVar2->n);
  }
  local_d8 = 2;
  if (pRVar9 == (REF_INT *)0x0) goto LAB_0022a830;
  iVar7 = pRVar2->n;
  local_c0 = pRVar11;
  if ((long)iVar7 < 0) {
    local_d8 = 1;
    pcVar24 = "malloc b_size of REF_INT negative";
LAB_0022a1c4:
    bVar28 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x64c
           ,"ref_migrate_shufflin_geom",pcVar24);
    pRVar9 = (REF_INT *)0x0;
  }
  else {
    pRVar9 = (REF_INT *)malloc((long)iVar7 * 4);
    if (pRVar9 == (REF_INT *)0x0) {
      local_d8 = 2;
      pcVar24 = "malloc b_size of REF_INT NULL";
      goto LAB_0022a1c4;
    }
    local_d8 = 2;
    bVar28 = true;
    if (iVar7 != 0) {
      lVar10 = 0;
      do {
        pRVar9[lVar10] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < pRVar2->n);
    }
  }
  if (!bVar28) goto LAB_0022a830;
  local_cc = 0;
  local_c8 = pRVar9;
  if (0 < ref_node_00->max) {
    do {
      if (((-1 < (int)local_cc) && (-1 < ref_node_00->global[local_cc])) &&
         (pRVar2->id != ref_node_00->part[local_cc])) {
        local_d8 = ref_adj_degree(pRVar4,local_cc,&local_74);
        if (local_d8 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x650,"ref_migrate_shufflin_geom",(ulong)local_d8,"adj deg");
          goto LAB_0022a830;
        }
        local_c0[ref_node_00->part[(int)local_cc]] =
             local_c0[ref_node_00->part[(int)local_cc]] + local_74;
      }
      local_cc = local_cc + 1;
    } while ((int)local_cc < ref_node_00->max);
  }
  local_d8 = ref_mpi_alltoall(pRVar2,local_c0,local_c8,1);
  if (local_d8 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x656
           ,"ref_migrate_shufflin_geom",(ulong)local_d8,"alltoall sizes");
    goto LAB_0022a830;
  }
  iVar7 = pRVar2->n;
  lVar10 = (long)iVar7;
  if (lVar10 < 1) {
    iVar27 = 0;
  }
  else {
    lVar12 = 0;
    iVar27 = 0;
    do {
      iVar27 = iVar27 + local_c0[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar10 != lVar12);
  }
  if (iVar27 < 0) {
    pcVar24 = "malloc a_int of REF_GLOB negative";
    uVar21 = 0x65a;
LAB_0022a3c1:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar21,"ref_migrate_shufflin_geom",pcVar24);
    local_d8 = 1;
  }
  else {
    local_b0 = malloc((ulong)(uint)(iVar27 * 6) << 3);
    if (local_b0 == (void *)0x0) {
      pcVar24 = "malloc a_int of REF_GLOB NULL";
      uVar21 = 0x65a;
    }
    else {
      local_b8 = (REF_INT *)malloc((ulong)(uint)(iVar27 * 2) << 3);
      if (local_b8 == (REF_INT *)0x0) {
        pcVar24 = "malloc a_real of REF_DBL NULL";
        uVar21 = 0x65b;
      }
      else {
        if (iVar7 < 1) {
          uVar6 = 0;
        }
        else {
          lVar12 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + local_c8[lVar12];
            lVar12 = lVar12 + 1;
          } while (lVar10 != lVar12);
        }
        if ((int)uVar6 < 0) {
          pcVar24 = "malloc b_int of REF_GLOB negative";
          uVar21 = 0x65f;
          goto LAB_0022a3c1;
        }
        local_a0 = (REF_DBL *)(ulong)(uVar6 * 2);
        pvVar14 = malloc((ulong)(uVar6 * 6) << 3);
        if (pvVar14 == (void *)0x0) {
          pcVar24 = "malloc b_int of REF_GLOB NULL";
          uVar21 = 0x65f;
        }
        else {
          local_88 = pvVar14;
          pvVar14 = malloc((long)local_a0 << 3);
          if (pvVar14 == (void *)0x0) {
            pcVar24 = "malloc b_real of REF_DBL NULL";
            uVar21 = 0x660;
          }
          else {
            local_80 = pvVar14;
            if (iVar7 < 0) {
              pcVar24 = "malloc a_next of REF_INT negative";
              uVar21 = 0x662;
              goto LAB_0022a3c1;
            }
            piVar19 = (int *)malloc(lVar10 * 4);
            if (piVar19 != (int *)0x0) {
              *piVar19 = 0;
              if (1 < iVar7) {
                iVar7 = *piVar19;
                lVar12 = 0;
                do {
                  iVar7 = iVar7 + local_c0[lVar12];
                  piVar19[lVar12 + 1] = iVar7;
                  lVar12 = lVar12 + 1;
                } while (lVar10 + -1 != lVar12);
              }
              local_cc = 0;
              local_98 = (void *)(ulong)(uint)ref_node_00->max;
              if (0 < ref_node_00->max) {
                local_68 = ref_node_00->global;
                lVar10 = 0;
                do {
                  if ((-1 < local_68[lVar10]) &&
                     (lVar12 = (long)ref_node_00->part[lVar10],
                     pRVar2->id != ref_node_00->part[lVar10])) {
                    uVar25 = 0xffffffff;
                    if (lVar10 < pRVar4->nnode) {
                      uVar25 = (ulong)(uint)pRVar4->first[lVar10];
                    }
                    if ((int)uVar25 != -1) {
                      RVar20 = pRVar4->item[(int)uVar25].ref;
                      pRVar9 = local_a8->descr;
                      local_a0 = local_a8->param;
                      local_90 = pRVar4->item;
                      lVar26 = (long)piVar19[lVar12];
                      pvVar14 = (void *)(lVar26 * 0x30 + (long)local_b0);
                      do {
                        lVar22 = 0;
                        do {
                          *(long *)((long)pvVar14 + lVar22 * 8) = (long)pRVar9[RVar20 * 6 + lVar22];
                          lVar22 = lVar22 + 1;
                        } while (lVar22 != 6);
                        iVar7 = pRVar9[(long)(RVar20 * 6) + 5];
                        lVar22 = -1;
                        if (((-1 < (long)iVar7) && (iVar7 < (int)local_98)) &&
                           (lVar22 = local_68[iVar7], lVar22 < 0)) {
                          lVar22 = -1;
                        }
                        *(long *)((long)local_b0 + lVar26 * 0x30 + 0x28) = lVar22;
                        *(REF_DBL *)(local_b8 + lVar26 * 4) = local_a0[RVar20 * 2];
                        *(REF_DBL *)(local_b8 + lVar26 * 4 + 2) = local_a0[RVar20 * 2 + 1];
                        iVar7 = (int)uVar25;
                        uVar25 = (ulong)local_90[iVar7].next;
                        if (uVar25 == 0xffffffffffffffff) {
                          RVar20 = -1;
                        }
                        else {
                          RVar20 = local_90[uVar25].ref;
                        }
                        lVar26 = lVar26 + 1;
                        pvVar14 = (void *)((long)pvVar14 + 0x30);
                      } while (local_90[iVar7].next != -1);
                      piVar19[lVar12] = (int)lVar26;
                      local_60 = lVar12;
                      local_58 = lVar10;
                    }
                  }
                  lVar10 = lVar10 + 1;
                  local_cc = (uint)lVar10;
                  local_98 = (void *)(long)ref_node_00->max;
                } while (lVar10 < (long)local_98);
              }
              local_70 = piVar19;
              local_d8 = ref_mpi_alltoallv(pRVar2,local_b0,local_c0,local_88,local_c8,6,2);
              if (local_d8 == 0) {
                local_d8 = ref_mpi_alltoallv(pRVar2,local_b8,local_c0,local_80,local_c8,2,3);
                if (local_d8 == 0) {
                  if (uVar6 != 0) {
                    uVar25 = 1;
                    if (1 < (int)uVar6) {
                      uVar25 = (ulong)uVar6;
                    }
                    uVar23 = 0;
                    pvVar14 = local_88;
                    do {
                      lVar10 = 0;
                      do {
                        local_48[lVar10] = *(int *)((long)pvVar14 + lVar10 * 8);
                        lVar10 = lVar10 + 1;
                      } while (lVar10 != 6);
                      local_d8 = ref_node_local(ref_node_00,
                                                *(REF_GLOB *)((long)local_88 + uVar23 * 0x30 + 0x28)
                                                ,(REF_INT *)&local_cc);
                      if (local_d8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x685,"ref_migrate_shufflin_geom",(ulong)local_d8,"g2l");
                        goto LAB_0022a830;
                      }
                      local_48[5] = local_cc;
                      local_d8 = ref_geom_add_with_descr
                                           (local_a8,local_48,
                                            (REF_DBL *)(uVar23 * 0x10 + (long)local_80));
                      if (local_d8 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x688,"ref_migrate_shufflin_geom",(ulong)local_d8,"geom add");
                        goto LAB_0022a830;
                      }
                      uVar23 = uVar23 + 1;
                      pvVar14 = (void *)((long)pvVar14 + 0x30);
                    } while (uVar23 != uVar25);
                  }
                  free(local_70);
                  free(local_80);
                  free(local_88);
                  free(local_b8);
                  free(local_b0);
                  free(local_c8);
                  free(local_c0);
                  local_d8 = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x67e,"ref_migrate_shufflin_geom",(ulong)local_d8,"alltoallv geom real");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x67b,"ref_migrate_shufflin_geom",(ulong)local_d8,"alltoallv geom int");
              }
              goto LAB_0022a830;
            }
            pcVar24 = "malloc a_next of REF_INT NULL";
            uVar21 = 0x662;
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
           uVar21,"ref_migrate_shufflin_geom",pcVar24);
    local_d8 = 2;
  }
LAB_0022a830:
  if (local_d8 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6a2
           ,"ref_migrate_shufflin",(ulong)local_d8,"geom");
    return local_d8;
  }
  lVar10 = 2;
  do {
    uVar6 = ref_migrate_shufflin_cell(ref_node,ref_grid->cell[lVar10 + -2]);
    if (uVar6 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x6a4,"ref_migrate_shufflin",(ulong)uVar6,"cell");
      return uVar6;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x12);
  if (0 < ref_node->max) {
    lVar10 = 0;
    uVar6 = 0;
    do {
      if (-1 < ref_node->global[lVar10]) {
        RVar20 = (REF_INT)lVar10;
        if (local_50->id == ref_node->part[lVar10]) {
          uVar8 = ref_geom_remove_without_cell(ref_grid,RVar20);
          if (uVar8 != 0) {
            uVar21 = 0x6ba;
            uVar25 = (ulong)uVar8;
            pcVar24 = "rm local geom without cell support";
            goto LAB_0022aa48;
          }
        }
        else {
          bVar28 = false;
          lVar12 = 2;
          do {
            bVar5 = !bVar28;
            bVar28 = true;
            if (bVar5) {
              pRVar4 = ref_grid->cell[lVar12 + -2]->ref_adj;
              bVar28 = false;
              if (lVar10 < pRVar4->nnode) {
                bVar28 = pRVar4->first[lVar10] != -1;
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 != 0x12);
          if (bVar28) {
            uVar8 = ref_geom_remove_without_cell(ref_grid,RVar20);
            if (uVar8 != 0) {
              uVar21 = 0x6b0;
              uVar25 = (ulong)uVar8;
              pcVar24 = "rm ghost geom without cell support";
LAB_0022aa48:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,uVar21,"ref_migrate_shufflin",uVar25,pcVar24);
              uVar6 = uVar8;
            }
          }
          else {
            uVar8 = ref_node_remove_without_global_invalidates_sorted(ref_node,RVar20);
            if (uVar8 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x6b3,"ref_migrate_shufflin",(ulong)uVar8,"remove");
              return uVar8;
            }
            uVar8 = ref_geom_remove_all(ref_grid->geom,RVar20);
            if (uVar8 != 0) {
              uVar21 = 0x6b4;
              uVar25 = (ulong)uVar8;
              pcVar24 = "rm geom";
              goto LAB_0022aa48;
            }
          }
        }
        if (uVar8 != 0) {
          return uVar6;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < ref_node->max);
  }
  uVar6 = ref_node_rebuild_sorted_global(ref_node);
  if (uVar6 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6bd
           ,"ref_migrate_shufflin",(ulong)uVar6,"rebuild");
    return uVar6;
  }
  uVar6 = ref_node_ghost_real(ref_node);
  if (uVar6 == 0) {
    uVar6 = ref_geom_ghost(ref_grid->geom,ref_node);
    if (uVar6 == 0) {
      return 0;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6c0
           ,"ref_migrate_shufflin",(ulong)uVar6,"ghost geom");
    return uVar6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x6bf,
         "ref_migrate_shufflin",(ulong)uVar6,"ghost real");
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT group, node;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_grid_mpi(ref_grid))) return REF_SUCCESS;

  RSS(ref_node_synchronize_globals(ref_node), "sync global nodes");

  RSS(ref_migrate_shufflin_node(ref_node), "send out nodes");
  RSS(ref_migrate_shufflin_geom(ref_grid), "geom");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_migrate_shufflin_cell(ref_node, ref_cell), "cell");
  }

  each_ref_node_valid_node(ref_node, node) {
    if (ref_mpi_rank(ref_mpi) != ref_node_part(ref_node, node)) {
      need_to_keep = REF_FALSE;
      each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
        need_to_keep =
            (need_to_keep || !ref_adj_empty(ref_cell_adj(ref_cell), node));
      }
      if (need_to_keep) {
        RSS(ref_geom_remove_without_cell(ref_grid, node),
            "rm ghost geom without cell support");
      } else {
        RSS(ref_node_remove_without_global_invalidates_sorted(ref_node, node),
            "remove");
        RSS(ref_geom_remove_all(ref_grid_geom(ref_grid), node), "rm geom");
      }
    } else {
      /* not sure why this is needed,
       * geom on a ghost that was removed from local? */
      RSS(ref_geom_remove_without_cell(ref_grid, node),
          "rm local geom without cell support");
    }
  }
  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild");

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  RSS(ref_geom_ghost(ref_grid_geom(ref_grid), ref_node), "ghost geom");

  return REF_SUCCESS;
}